

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  int local_1c;
  int rc;
  Expr *pExpr_local;
  NameContext *pName_local;
  
  local_1c = 0;
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op == '\x1b') {
      pExpr->op = 'a';
    }
    else {
      local_1c = sqlite3ResolveExprNames(pName,pExpr);
    }
  }
  return local_1c;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}